

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O3

void __thiscall p2t::SweepContext::InitTriangulation(SweepContext *this)

{
  __normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>
  __first;
  __normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_> __last
  ;
  long lVar1;
  double dVar2;
  ulong uVar3;
  Point *pPVar4;
  Point *pPVar5;
  __normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_> _Var6;
  Point **ppPVar7;
  __normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_> __i;
  Point **ppPVar8;
  value_type __val;
  size_t __n;
  ulong uVar9;
  __normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_> _Var10
  ;
  value_type __val_2;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  __first._M_current =
       (this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar9 = (long)__last._M_current - (long)__first._M_current >> 3;
  dVar11 = (*__first._M_current)->x;
  dVar13 = (*__first._M_current)->y;
  dVar14 = dVar11;
  dVar15 = dVar13;
  if (__last._M_current != __first._M_current) {
    uVar3 = 0;
    do {
      dVar12 = __first._M_current[uVar3]->x;
      dVar2 = __first._M_current[uVar3]->y;
      dVar14 = (double)(~-(ulong)(dVar12 < dVar14) & (ulong)dVar14 |
                       (ulong)dVar12 & -(ulong)(dVar12 < dVar14));
      dVar15 = (double)(~-(ulong)(dVar15 < dVar2) & (ulong)dVar15 |
                       (ulong)dVar2 & -(ulong)(dVar15 < dVar2));
      dVar11 = (double)(~-(ulong)(dVar11 < dVar12) & (ulong)dVar11 |
                       (ulong)dVar12 & -(ulong)(dVar11 < dVar12));
      dVar13 = (double)(~-(ulong)(dVar2 < dVar13) & (ulong)dVar13 |
                       (ulong)dVar2 & -(ulong)(dVar2 < dVar13));
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) < uVar9);
  }
  pPVar4 = (Point *)operator_new(0x28);
  dVar12 = (dVar11 - dVar14) * 0.3;
  dVar13 = dVar13 - (dVar15 - dVar13) * 0.3;
  pPVar4->x = dVar11 + dVar12;
  pPVar4->y = dVar13;
  (pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->head_ = pPVar4;
  pPVar4 = (Point *)operator_new(0x28);
  pPVar4->x = dVar14 - dVar12;
  pPVar4->y = dVar13;
  (pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->tail_ = pPVar4;
  if (__first._M_current != __last._M_current) {
    lVar1 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<p2t::Point**,std::vector<p2t::Point*,std::allocator<p2t::Point*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(p2t::Point_const*,p2t::Point_const*)>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_p2t::Point_*,_const_p2t::Point_*)>)0x63a44e);
    ppPVar8 = __first._M_current + 1;
    _Var10._M_current = __first._M_current;
    if ((long)__last._M_current - (long)__first._M_current < 0x81) {
      for (; ppPVar8 != __last._M_current; ppPVar8 = ppPVar8 + 1) {
        pPVar4 = *ppPVar8;
        dVar11 = pPVar4->y;
        dVar13 = (*__first._M_current)->y;
        if (dVar11 < dVar13) {
LAB_00639dd4:
          memmove((void *)((long)_Var10._M_current +
                          (0x10 - ((long)ppPVar8 - (long)__first._M_current))),__first._M_current,
                  (long)ppPVar8 - (long)__first._M_current);
          _Var6._M_current = __first._M_current;
        }
        else {
          if (((dVar11 == dVar13) && (!NAN(dVar11) && !NAN(dVar13))) &&
             (dVar13 = (*__first._M_current)->x, pPVar4->x <= dVar13 && dVar13 != pPVar4->x))
          goto LAB_00639dd4;
          pPVar5 = *_Var10._M_current;
          dVar13 = pPVar5->y;
          if (dVar11 < dVar13) {
LAB_00639e25:
            do {
              do {
                _Var6._M_current = _Var10._M_current;
                _Var6._M_current[1] = pPVar5;
                pPVar5 = _Var6._M_current[-1];
                dVar11 = pPVar4->y;
                dVar13 = pPVar5->y;
                _Var10._M_current = _Var6._M_current + -1;
              } while (dVar11 < dVar13);
            } while (((dVar11 == dVar13) && (!NAN(dVar11) && !NAN(dVar13))) &&
                    (pPVar4->x <= pPVar5->x && pPVar5->x != pPVar4->x));
          }
          else {
            _Var6._M_current = ppPVar8;
            if (((dVar11 == dVar13) && (!NAN(dVar11) && !NAN(dVar13))) &&
               (pPVar4->x <= pPVar5->x && pPVar5->x != pPVar4->x)) goto LAB_00639e25;
          }
        }
        *_Var6._M_current = pPVar4;
        _Var10._M_current = ppPVar8;
      }
    }
    else {
      __n = 8;
      do {
        ppPVar7 = __first._M_current + __n;
        pPVar4 = *(Point **)((long)__first._M_current + __n);
        dVar11 = pPVar4->y;
        dVar13 = (*__first._M_current)->y;
        if (dVar11 < dVar13) {
LAB_00639d17:
          memmove(ppPVar8,__first._M_current,__n);
          _Var6._M_current = __first._M_current;
        }
        else {
          if (((dVar11 == dVar13) && (!NAN(dVar11) && !NAN(dVar13))) &&
             (dVar13 = (*__first._M_current)->x, pPVar4->x <= dVar13 && dVar13 != pPVar4->x))
          goto LAB_00639d17;
          pPVar5 = *_Var10._M_current;
          dVar13 = pPVar5->y;
          if (dVar11 < dVar13) {
LAB_00639d64:
            do {
              do {
                _Var6._M_current = _Var10._M_current;
                _Var6._M_current[1] = pPVar5;
                pPVar5 = _Var6._M_current[-1];
                dVar11 = pPVar4->y;
                dVar13 = pPVar5->y;
                _Var10._M_current = _Var6._M_current + -1;
              } while (dVar11 < dVar13);
            } while (((dVar11 == dVar13) && (!NAN(dVar11) && !NAN(dVar13))) &&
                    (pPVar4->x <= pPVar5->x && pPVar5->x != pPVar4->x));
          }
          else {
            _Var6._M_current = ppPVar7;
            if (((dVar11 == dVar13) && (!NAN(dVar11) && !NAN(dVar13))) &&
               (pPVar4->x <= pPVar5->x && pPVar5->x != pPVar4->x)) goto LAB_00639d64;
          }
        }
        *_Var6._M_current = pPVar4;
        __n = __n + 8;
        _Var10._M_current = ppPVar7;
      } while (__n != 0x80);
      for (ppPVar8 = __first._M_current + 0x10; ppPVar8 != __last._M_current; ppPVar8 = ppPVar8 + 1)
      {
        pPVar5 = ppPVar8[-1];
        pPVar4 = *ppPVar8;
        dVar11 = pPVar4->y;
        dVar13 = pPVar5->y;
        ppPVar7 = ppPVar8;
        if (dVar11 < dVar13) {
LAB_00639e95:
          while( true ) {
            *ppPVar7 = pPVar5;
            pPVar5 = ppPVar7[-2];
            dVar11 = pPVar4->y;
            dVar13 = pPVar5->y;
            if ((dVar13 <= dVar11) &&
               (((dVar11 != dVar13 || (NAN(dVar11) || NAN(dVar13))) ||
                (pPVar5->x < pPVar4->x || pPVar5->x == pPVar4->x)))) break;
            ppPVar7 = ppPVar7 + -1;
          }
          ppPVar7 = ppPVar7 + -1;
        }
        else if (((dVar11 == dVar13) && (!NAN(dVar11) && !NAN(dVar13))) &&
                (pPVar4->x <= pPVar5->x && pPVar5->x != pPVar4->x)) goto LAB_00639e95;
        *ppPVar7 = pPVar4;
      }
    }
  }
  return;
}

Assistant:

void SweepContext::InitTriangulation()
{
  double xmax(points_[0]->x), xmin(points_[0]->x);
  double ymax(points_[0]->y), ymin(points_[0]->y);

  // Calculate bounds.
  for (unsigned int i = 0; i < points_.size(); i++) {
    Point& p = *points_[i];
    if (p.x > xmax)
      xmax = p.x;
    if (p.x < xmin)
      xmin = p.x;
    if (p.y > ymax)
      ymax = p.y;
    if (p.y < ymin)
      ymin = p.y;
  }

  double dx = kAlpha * (xmax - xmin);
  double dy = kAlpha * (ymax - ymin);
  head_ = new Point(xmax + dx, ymin - dy);
  tail_ = new Point(xmin - dx, ymin - dy);

  // Sort points along y-axis
  std::sort(points_.begin(), points_.end(), cmp);

}